

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::Function::WhileEachInst
          (Function *this,function<bool_(const_spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts,bool run_on_non_semantic_insts)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_00;
  pointer puVar1;
  Instruction *pIVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *param;
  pointer puVar6;
  pointer puVar7;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *non_semantic;
  
  this_00._M_head_impl =
       (this->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((this_00._M_head_impl != (Instruction *)0x0) &&
     (bVar4 = Instruction::WhileEachInst(this_00._M_head_impl,f,run_on_debug_line_insts), !bVar4)) {
    return false;
  }
  puVar6 = (this->params_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->params_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar1) {
      pIVar2 = &(this->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                sentinel_;
      do {
        pIVar2 = *(Instruction **)
                  ((long)&pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
        if (pIVar2 == &(this->debug_insts_in_header_).
                       super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
          puVar7 = (this->blocks_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar3 = (this->blocks_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          do {
            if (puVar7 == puVar3) {
              pIVar2 = (this->end_inst_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
              if (pIVar2 == (Instruction *)0x0) {
                if (!run_on_non_semantic_insts) {
                  return true;
                }
              }
              else {
                bVar4 = Instruction::WhileEachInst(pIVar2,f,run_on_debug_line_insts);
                if (!bVar4 || !run_on_non_semantic_insts) {
                  return bVar4;
                }
              }
              puVar6 = (this->non_semantic_).
                       super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (this->non_semantic_).
                       super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              do {
                bVar4 = puVar6 == puVar1;
                if (bVar4) {
                  return bVar4;
                }
                bVar5 = Instruction::WhileEachInst
                                  ((puVar6->_M_t).
                                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                   _M_head_impl,f,run_on_debug_line_insts);
                puVar6 = puVar6 + 1;
              } while (bVar5);
              return bVar4;
            }
            bVar4 = BasicBlock::WhileEachInst
                              ((puVar7->_M_t).
                               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                               _M_head_impl,f,run_on_debug_line_insts);
            puVar7 = puVar7 + 1;
          } while (bVar4);
          return false;
        }
        bVar4 = Instruction::WhileEachInst(pIVar2,f,run_on_debug_line_insts);
      } while (bVar4);
      return false;
    }
    bVar4 = Instruction::WhileEachInst
                      ((puVar6->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,f,
                       run_on_debug_line_insts);
    puVar6 = puVar6 + 1;
  } while (bVar4);
  return false;
}

Assistant:

bool Function::WhileEachInst(const std::function<bool(const Instruction*)>& f,
                             bool run_on_debug_line_insts,
                             bool run_on_non_semantic_insts) const {
  if (def_inst_) {
    if (!static_cast<const Instruction*>(def_inst_.get())
             ->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (const auto& param : params_) {
    if (!static_cast<const Instruction*>(param.get())
             ->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (const auto& di : debug_insts_in_header_) {
    if (!static_cast<const Instruction*>(&di)->WhileEachInst(
            f, run_on_debug_line_insts))
      return false;
  }

  for (const auto& bb : blocks_) {
    if (!static_cast<const BasicBlock*>(bb.get())->WhileEachInst(
            f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (end_inst_) {
    if (!static_cast<const Instruction*>(end_inst_.get())
             ->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (run_on_non_semantic_insts) {
    for (auto& non_semantic : non_semantic_) {
      if (!static_cast<const Instruction*>(non_semantic.get())
               ->WhileEachInst(f, run_on_debug_line_insts)) {
        return false;
      }
    }
  }

  return true;
}